

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTest.h
# Opt level: O2

void __thiscall
oout::NamedTest::NamedTest<oout::NamedTest,oout::NamedTest>
          (NamedTest *this,string *name,shared_ptr<const_oout::Test> *test1,
          shared_ptr<const_oout::Test> *test2,shared_ptr<oout::NamedTest> *tests,
          shared_ptr<oout::NamedTest> *tests_1)

{
  shared_ptr<const_oout::Test> local_48;
  shared_ptr<const_oout::Test> local_38;
  
  std::
  make_shared<oout::SuiteTest_const,std::shared_ptr<oout::Test_const>const&,std::shared_ptr<oout::Test_const>const&,std::shared_ptr<oout::NamedTest>const&,std::shared_ptr<oout::NamedTest>const&>
            (&local_48,test1,(shared_ptr<oout::NamedTest> *)test2,tests);
  local_38.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_48.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_48.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  NamedTest(this,name,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

NamedTest(
		const std::string &name,
		const std::shared_ptr<const Test> &test1,
		const std::shared_ptr<const Test> &test2,
		const std::shared_ptr<T> & ... tests
	) : NamedTest(name, std::make_shared<const SuiteTest>(test1, test2, tests...))
	{
	}